

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast-check.cpp
# Opt level: O2

void __thiscall
wasm::CastCheckTest_CastToSibling_Test::~CastCheckTest_CastToSibling_Test
          (CastCheckTest_CastToSibling_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F(CastCheckTest, CastToSibling) {
#define EXPECT_CAST(                                                           \
  srcNullability, srcExactness, castNullability, castExactness, result)        \
  EXPECT_EQ(evaluateCastCheck(Type(sub, srcNullability, srcExactness),         \
                              Type(subFinal, castNullability, castExactness)), \
            result);

  EXPECT_CAST(Nullable, Inexact, Nullable, Inexact, SuccessOnlyIfNull);
  EXPECT_CAST(Nullable, Inexact, Nullable, Exact, SuccessOnlyIfNull);
  EXPECT_CAST(Nullable, Inexact, NonNullable, Inexact, Failure);
  EXPECT_CAST(Nullable, Inexact, NonNullable, Exact, Failure);
  EXPECT_CAST(Nullable, Exact, Nullable, Inexact, SuccessOnlyIfNull);
  EXPECT_CAST(Nullable, Exact, Nullable, Exact, SuccessOnlyIfNull);
  EXPECT_CAST(Nullable, Exact, NonNullable, Inexact, Failure);
  EXPECT_CAST(Nullable, Exact, NonNullable, Exact, Failure);
  EXPECT_CAST(NonNullable, Inexact, Nullable, Inexact, Failure);
  EXPECT_CAST(NonNullable, Inexact, Nullable, Exact, Failure);
  EXPECT_CAST(NonNullable, Inexact, NonNullable, Inexact, Failure);
  EXPECT_CAST(NonNullable, Inexact, NonNullable, Exact, Failure);
  EXPECT_CAST(NonNullable, Exact, Nullable, Inexact, Failure);
  EXPECT_CAST(NonNullable, Exact, Nullable, Exact, Failure);
  EXPECT_CAST(NonNullable, Exact, NonNullable, Inexact, Failure);
  EXPECT_CAST(NonNullable, Exact, NonNullable, Exact, Failure);
#undef EXPECT_CAST
}